

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O1

void __thiscall
Assimp::HMPImporter::InternReadFile
          (HMPImporter *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  aiScene *paVar1;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *prVar3;
  uchar *puVar4;
  runtime_error *prVar5;
  long *plVar6;
  Logger *pLVar7;
  long *extraout_RAX;
  long *plVar8;
  size_type *psVar9;
  runtime_error *extraout_RDX;
  char szBuffer [5];
  runtime_error *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_MDLImporter).pScene = _pScene;
  (this->super_MDLImporter).pIOHandler = _pIOHandler;
  local_b0 = (runtime_error *)&local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"rb","");
  iVar2 = (*_pIOHandler->_vptr_IOSystem[4])(_pIOHandler,(pFile->_M_dataplus)._M_p,local_b0);
  plVar6 = (long *)CONCAT44(extraout_var,iVar2);
  if (local_b0 != (runtime_error *)&local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (plVar6 == (long *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_90,"Failed to open HMP file ",pFile);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0 = (runtime_error *)*plVar6;
    prVar5 = (runtime_error *)(plVar6 + 2);
    if (local_b0 == prVar5) {
      local_a0 = *(long *)prVar5;
      lStack_98 = plVar6[3];
      local_b0 = (runtime_error *)&local_a0;
      goto LAB_00428f99;
    }
  }
  else {
    prVar3 = (runtime_error *)(**(code **)(*plVar6 + 0x30))(plVar6);
    if (prVar3 < (runtime_error *)0x32) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0 = (runtime_error *)&local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"HMP File is too small.","");
      std::runtime_error::runtime_error(prVar5,(string *)&local_b0);
      *(undefined ***)prVar5 = &PTR__runtime_error_008e3168;
      __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar4 = (uchar *)operator_new__((ulong)prVar3);
    (this->super_MDLImporter).mBuffer = puVar4;
    prVar5 = prVar3;
    (**(code **)(*plVar6 + 0x10))(plVar6,puVar4,1);
    (this->super_MDLImporter).iFileSize = (uint)prVar3;
    iVar2 = *(int *)(this->super_MDLImporter).mBuffer;
    if (iVar2 < 0x484d5034) {
      if (iVar2 == 0x35504d48) {
LAB_00428e55:
        pLVar7 = DefaultLogger::get();
        Logger::debug(pLVar7,"HMP subtype: 3D GameStudio A5, magic word is HMP5");
        InternReadFile_HMP5(this);
LAB_00428e71:
        paVar1 = (this->super_MDLImporter).pScene;
        paVar1->mFlags = paVar1->mFlags | 0x10;
        puVar4 = (this->super_MDLImporter).mBuffer;
        if (puVar4 != (uchar *)0x0) {
          operator_delete__(puVar4);
        }
        (this->super_MDLImporter).mBuffer = (uchar *)0x0;
        (**(code **)(*plVar6 + 8))(plVar6);
        return;
      }
      if (iVar2 == 0x37504d48) {
LAB_00428e37:
        pLVar7 = DefaultLogger::get();
        Logger::debug(pLVar7,"HMP subtype: 3D GameStudio A7, magic word is HMP7");
        InternReadFile_HMP7(this);
        goto LAB_00428e71;
      }
      if (iVar2 != 0x34504d48) {
LAB_00428daa:
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"Unknown HMP subformat ",pFile);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70 = (long *)*plVar6;
        plVar8 = plVar6 + 2;
        if (local_70 == plVar8) {
          local_60 = *plVar8;
          lStack_58 = plVar6[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar8;
        }
        local_68 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_90._M_dataplus._M_p = (pointer)*plVar6;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar9) {
          local_90.field_2._M_allocated_capacity = *psVar9;
          local_90.field_2._8_8_ = plVar6[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar9;
        }
        local_90._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_b0 = (runtime_error *)*plVar6;
        prVar3 = (runtime_error *)(plVar6 + 2);
        if (local_b0 == prVar3) {
          local_a0 = *(long *)prVar3;
          lStack_98 = plVar6[3];
          local_b0 = (runtime_error *)&local_a0;
        }
        else {
          local_a0 = *(long *)prVar3;
        }
        local_a8 = plVar6[1];
        *plVar6 = (long)prVar3;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::runtime_error::runtime_error(prVar5,(string *)&local_b0);
        *(undefined ***)prVar5 = &PTR__runtime_error_008e3168;
        __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (iVar2 == 0x484d5035) goto LAB_00428e55;
      if (iVar2 == 0x484d5037) goto LAB_00428e37;
      if (iVar2 != 0x484d5034) goto LAB_00428daa;
    }
    pLVar7 = DefaultLogger::get();
    Logger::debug(pLVar7,"HMP subtype: 3D GameStudio A4, magic word is HMP4");
    InternReadFile_HMP4((HMPImporter *)pLVar7);
    plVar6 = extraout_RAX;
    local_b0 = extraout_RDX;
  }
  local_a0 = *(long *)prVar5;
LAB_00428f99:
  local_a8 = plVar6[1];
  *plVar6 = (long)prVar5;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(prVar3,(string *)&local_b0);
  *(undefined ***)prVar3 = &PTR__runtime_error_008e3168;
  __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HMPImporter::InternReadFile( const std::string& pFile,
                                 aiScene* _pScene, IOSystem* _pIOHandler)
{
    pScene     = _pScene;
    pIOHandler = _pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open HMP file " + pFile + ".");

    // Check whether the HMP file is large enough to contain
    // at least the file header
    const size_t fileSize = file->FileSize();
    if( fileSize < 50)
        throw DeadlyImportError( "HMP File is too small.");

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer = new uint8_t[fileSize];
    file->Read( (void*)mBuffer, 1, fileSize);
    iFileSize = (unsigned int)fileSize;

    // Determine the file subtype and call the appropriate member function
    const uint32_t iMagic = *((uint32_t*)this->mBuffer);

    // HMP4 format
    if (AI_HMP_MAGIC_NUMBER_LE_4 == iMagic ||
        AI_HMP_MAGIC_NUMBER_BE_4 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A4, magic word is HMP4");
        InternReadFile_HMP4();
    }
    // HMP5 format
    else if (AI_HMP_MAGIC_NUMBER_LE_5 == iMagic ||
             AI_HMP_MAGIC_NUMBER_BE_5 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A5, magic word is HMP5");
        InternReadFile_HMP5();
    }
    // HMP7 format
    else if (AI_HMP_MAGIC_NUMBER_LE_7 == iMagic ||
             AI_HMP_MAGIC_NUMBER_BE_7 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A7, magic word is HMP7");
        InternReadFile_HMP7();
    }
    else
    {
        // Print the magic word to the logger
        char szBuffer[5];
        szBuffer[0] = ((char*)&iMagic)[0];
        szBuffer[1] = ((char*)&iMagic)[1];
        szBuffer[2] = ((char*)&iMagic)[2];
        szBuffer[3] = ((char*)&iMagic)[3];
        szBuffer[4] = '\0';

        // We're definitely unable to load this file
        throw DeadlyImportError( "Unknown HMP subformat " + pFile +
            ". Magic word (" + szBuffer + ") is not known");
    }

    // Set the AI_SCENE_FLAGS_TERRAIN bit
    pScene->mFlags |= AI_SCENE_FLAGS_TERRAIN;

    delete[] mBuffer;
    mBuffer= nullptr;

}